

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O1

void nameinfo_callback(void *arg,int status,int timeouts,hostent *host)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t buflen;
  long lVar4;
  undefined4 in_register_00000034;
  undefined8 uVar5;
  char srvbuf [33];
  char buf [255];
  char acStack_158 [48];
  char local_128 [264];
  
  lVar4 = (long)timeouts + *(long *)((long)arg + 0x38);
  *(long *)((long)arg + 0x38) = lVar4;
  if (status == 4) {
    if ((*(byte *)((long)arg + 0x30) & 4) != 0) goto LAB_00111121;
    if (*(int *)((long)arg + 0x2c) == 2) {
      buflen = 0x3e;
      ares_inet_ntop(2,(void *)((long)arg + 0x14),local_128,0x3e);
    }
    else {
      buflen = 0x3e;
      ares_inet_ntop(10,(void *)((long)arg + 0x18),local_128,0x3e);
      append_scopeid((sockaddr_in6 *)((long)arg + 0x10),*(uint *)((long)arg + 0x30),local_128,buflen
                    );
    }
    if ((*(uint *)((long)arg + 0x30) >> 9 & 1) == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                              acStack_158,buflen);
    }
    uVar5 = *(undefined8 *)((long)arg + 8);
    uVar1 = *(undefined4 *)((long)arg + 0x38);
    pcVar3 = local_128;
  }
  else {
    if (status != 0) {
LAB_00111121:
      (**arg)(*(undefined8 *)((long)arg + 8),CONCAT44(in_register_00000034,status),lVar4,0,0);
      ares_free(arg);
      return;
    }
    if ((*(uint *)((long)arg + 0x30) >> 9 & 1) == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                              acStack_158,(size_t)host);
    }
    if ((*(byte *)((long)arg + 0x30) & 1) != 0) {
      gethostname(local_128,0xff);
      pcVar3 = strchr(local_128,0x2e);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = ares_striendstr(host->h_name,pcVar3);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
      }
    }
    uVar5 = *(undefined8 *)((long)arg + 8);
    uVar1 = *(undefined4 *)((long)arg + 0x38);
    pcVar3 = host->h_name;
  }
  (**arg)(uVar5,0,uVar1,pcVar3,pcVar2);
  ares_free(arg);
  return;
}

Assistant:

static void nameinfo_callback(void *arg, int status, int timeouts,
                              struct hostent *host)
{
  struct nameinfo_query *niquery = (struct nameinfo_query *)arg;
  char                   srvbuf[33];
  char                  *service = NULL;

  niquery->timeouts += (size_t)timeouts;
  if (status == ARES_SUCCESS) {
    /* They want a service too */
    if (niquery->flags & ARES_NI_LOOKUPSERVICE) {
      if (niquery->family == AF_INET) {
        service = lookup_service(niquery->addr.addr4.sin_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      } else {
        service = lookup_service(niquery->addr.addr6.sin6_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      }
    }
    /* NOFQDN means we have to strip off the domain name portion.  We do
       this by determining our own domain name, then searching the string
       for this domain name and removing it.
     */
#ifdef HAVE_GETHOSTNAME
    if (niquery->flags & ARES_NI_NOFQDN) {
      char        buf[255];
      const char *domain;
      gethostname(buf, 255);
      if ((domain = strchr(buf, '.')) != NULL) {
        char *end = ares_striendstr(host->h_name, domain);
        if (end) {
          *end = 0;
        }
      }
    }
#endif
    niquery->callback(niquery->arg, ARES_SUCCESS, (int)niquery->timeouts,
                      host->h_name, service);
    ares_free(niquery);
    return;
  }
  /* We couldn't find the host, but it's OK, we can use the IP */
  else if (status == ARES_ENOTFOUND && !(niquery->flags & ARES_NI_NAMEREQD)) {
    char ipbuf[IPBUFSIZ];
    if (niquery->family == AF_INET) {
      ares_inet_ntop(AF_INET, &niquery->addr.addr4.sin_addr, ipbuf, IPBUFSIZ);
    } else {
      ares_inet_ntop(AF_INET6, &niquery->addr.addr6.sin6_addr, ipbuf, IPBUFSIZ);
#ifdef HAVE_STRUCT_SOCKADDR_IN6_SIN6_SCOPE_ID
      append_scopeid(&niquery->addr.addr6, niquery->flags, ipbuf,
                     sizeof(ipbuf));
#endif
    }
    /* They want a service too */
    if (niquery->flags & ARES_NI_LOOKUPSERVICE) {
      if (niquery->family == AF_INET) {
        service = lookup_service(niquery->addr.addr4.sin_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      } else {
        service = lookup_service(niquery->addr.addr6.sin6_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      }
    }
    niquery->callback(niquery->arg, ARES_SUCCESS, (int)niquery->timeouts, ipbuf,
                      service);
    ares_free(niquery);
    return;
  }
  niquery->callback(niquery->arg, status, (int)niquery->timeouts, NULL, NULL);
  ares_free(niquery);
}